

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deflate_stream.cpp
# Opt level: O0

string * __thiscall
boost::deflate::deflate_stream_test::decompress_abi_cxx11_
          (string *__return_storage_ptr__,deflate_stream_test *this,string_view *in,wrap wrap)

{
  int iVar1;
  logic_error *plVar2;
  size_type sVar3;
  undefined1 auStack_98 [8];
  z_stream zs;
  int result;
  wrap wrap_local;
  string_view *in_local;
  string *out;
  
  zs.reserved._7_1_ = 0;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  zs.data_type = 0;
  zs._92_4_ = 0;
  zs.adler = 0;
  zs.zfree = (free_func)0x0;
  zs.opaque = (voidpf)0x0;
  zs.state = (internal_state *)0x0;
  zs.zalloc = (alloc_func)0x0;
  zs.total_out = 0;
  zs.msg = (char *)0x0;
  zs.next_out = (Bytef *)0x0;
  zs.avail_out = 0;
  zs._36_4_ = 0;
  zs.avail_in = 0;
  zs._12_4_ = 0;
  zs.total_in = 0;
  auStack_98 = (undefined1  [8])0x0;
  zs.next_in = (Bytef *)0x0;
  iVar1 = 0xf;
  if ((char)in == '\0') {
    iVar1 = -0xf;
  }
  iVar1 = inflateInit2_((z_streamp)auStack_98,iVar1,"1.2.11",0x70);
  if (iVar1 == 0) {
    auStack_98 = (undefined1  [8])
                 basic_string_view<char,_std::char_traits<char>_>::data
                           ((basic_string_view<char,_std::char_traits<char>_> *)this);
    sVar3 = basic_string_view<char,_std::char_traits<char>_>::size
                      ((basic_string_view<char,_std::char_traits<char>_> *)this);
    zs.next_in = (Bytef *)CONCAT44(zs.next_in._4_4_,(int)sVar3);
    while( true ) {
      std::__cxx11::string::resize((ulong)__return_storage_ptr__);
      zs.total_in = std::__cxx11::string::operator[]((ulong)__return_storage_ptr__);
      iVar1 = std::__cxx11::string::size();
      zs.next_out = (Bytef *)CONCAT44(zs.next_out._4_4_,iVar1 - zs.avail_out);
      iVar1 = inflate((z_streamp)auStack_98,2);
      if (((iVar1 == 2) || (iVar1 == -3)) || (iVar1 == -4)) break;
      if (((int)zs.next_out != 0) || (iVar1 == 1)) {
        std::__cxx11::string::resize((ulong)__return_storage_ptr__);
        inflateEnd((z_streamp)auStack_98);
        return __return_storage_ptr__;
      }
    }
    plVar2 = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error(plVar2,"inflate failed");
    __cxa_throw(plVar2,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  plVar2 = (logic_error *)__cxa_allocate_exception(0x10);
  std::logic_error::logic_error(plVar2,"inflateInit2 failed");
  __cxa_throw(plVar2,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

static
    std::string decompress(string_view const& in, wrap wrap =boost::deflate::wrap::none)
    {
        int result;
        std::string out;
        z_stream zs;
        memset(&zs, 0, sizeof(zs));
        result = inflateInit2(&zs, wrap == boost::deflate::wrap::none ? -15 : 15);
        if(result != Z_OK)
            throw std::logic_error{"inflateInit2 failed"};
        try
        {
            zs.next_in = (Bytef*)in.data();
            zs.avail_in = static_cast<uInt>(in.size());
            for(;;)
            {
                out.resize(zs.total_out + 1024);
                zs.next_out = (Bytef*)&out[zs.total_out];
                zs.avail_out = static_cast<uInt>(
                    out.size() - zs.total_out);
                result = inflate(&zs, Z_SYNC_FLUSH);
                if( result == Z_NEED_DICT ||
                    result == Z_DATA_ERROR ||
                    result == Z_MEM_ERROR)
                {
                    throw std::logic_error("inflate failed");
                }
                if(zs.avail_out > 0)
                    break;
                if(result == Z_STREAM_END)
                    break;
            }
            out.resize(zs.total_out);
            inflateEnd(&zs);
        }
        catch(...)
        {
            inflateEnd(&zs);
            throw;
        }
        return out;
    }